

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

int __thiscall Bstrlib::String::Find(String *this,char *b,int pos)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uchar *puVar6;
  long lVar7;
  
  iVar3 = -1;
  iVar4 = iVar3;
  if (b != (char *)0x0) {
    uVar1 = (this->super_tagbstring).slen;
    if ((((uint)pos <= uVar1) && (iVar4 = pos, *b != '\0')) && (iVar4 = iVar3, uVar1 != pos)) {
      lVar5 = (long)pos;
      puVar6 = (this->super_tagbstring).data + lVar5;
      do {
        lVar7 = 0;
        while( true ) {
          if ((long)(int)uVar1 <= lVar5 + lVar7) {
            return -1;
          }
          if (b[lVar7] != puVar6[lVar7]) break;
          lVar2 = lVar7 + 1;
          lVar7 = lVar7 + 1;
          if (b[lVar2] == '\0') {
            return (int)lVar5;
          }
        }
        lVar5 = lVar5 + 1;
        puVar6 = puVar6 + 1;
      } while( true );
    }
  }
  return iVar4;
}

Assistant:

int String::Find(const char * b, int pos) const
    {
        int i, j;

        if (NULL == b) return BSTR_ERR;

        if ((unsigned int) pos > (unsigned int) slen)
            return BSTR_ERR;
        if ('\0' == b[0])            return pos;
        if (pos == slen)            return BSTR_ERR;

        i = pos;
        j = 0;

        for (; i + j < slen; )
        {
            if ((unsigned char) b[j] == data[i + j])
            {
                j++;
                if ('\0' == b[j])    return i;
                continue;
            }
            i++;
            j = 0;
        }

        return BSTR_ERR;
    }